

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O2

UINT8 device_start_k053260(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA chip;
  uint uVar1;
  long lVar2;
  UINT8 UVar3;
  
  chip.chipInf = calloc(1,0xe8);
  if ((DEV_DATA *)chip.chipInf == (DEV_DATA *)0x0) {
    UVar3 = 0xff;
  }
  else {
    for (lVar2 = 0x28; lVar2 != 200; lVar2 = lVar2 + 0x28) {
      *(void **)((long)chip.chipInf + lVar2) = chip.chipInf;
      KDSC_voice_reset((KDSC_Voice *)((long)chip.chipInf + lVar2));
    }
    uVar1 = cfg->clock >> 6;
    if (cfg->srMode == '\x02') {
      if (uVar1 <= cfg->smplRate) {
        uVar1 = cfg->smplRate;
      }
    }
    else if (cfg->srMode == '\x01') {
      uVar1 = cfg->smplRate;
    }
    UVar3 = '\0';
    ((DEV_DATA *)((long)chip.chipInf + 0xd8))->chipInf =
         (void *)(CONCAT44(cfg->clock,uVar1 >> 1) / (ulong)uVar1);
    k053260_set_mute_mask(chip.chipInf,0);
    *(void **)chip.chipInf = chip.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)chip.chipInf;
    retDevInf->sampleRate = uVar1;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_k053260(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	k053260_state *info;
	UINT32 rate;
	int i;

	info = (k053260_state *)calloc(1, sizeof(k053260_state));
	if (info == NULL)
		return 0xFF;

	info->rom = NULL;
	info->rom_size = 0x00;
	info->rom_mask = 0x00;

	for (i = 0; i < 4; i++)
		KDSC_voice_start(&info->voice[i], info);

	rate = cfg->clock / CLOCKS_PER_SAMPLE;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);

	RC_SET_RATIO(&info->cycleCntr, cfg->clock, rate);

	k053260_set_mute_mask(info, 0x00);

	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, rate, &devDef);

	return 0x00;
}